

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::copyFieldsFrom(UnicodeString *this,UnicodeString *src,UBool setSrcToBogus)

{
  ushort uVar1;
  
  uVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
  (this->fUnion).fStackFields.fLengthAndFlags = uVar1;
  if ((uVar1 & 2) == 0) {
    (this->fUnion).fFields.fArray = (src->fUnion).fFields.fArray;
    (this->fUnion).fFields.fCapacity = (src->fUnion).fFields.fCapacity;
    if ((short)uVar1 < 0) {
      (this->fUnion).fFields.fLength = (src->fUnion).fFields.fLength;
    }
    if (setSrcToBogus != '\0') {
      (src->fUnion).fStackFields.fLengthAndFlags = 1;
      (src->fUnion).fFields.fArray = (char16_t *)0x0;
      (src->fUnion).fFields.fCapacity = 0;
    }
  }
  else if (this != src) {
    memcpy((void *)((long)&this->fUnion + 2),(void *)((long)&src->fUnion + 2),
           (long)(((int)(short)uVar1 >> 5) * 2));
    return;
  }
  return;
}

Assistant:

void UnicodeString::copyFieldsFrom(UnicodeString &src, UBool setSrcToBogus) U_NOEXCEPT {
  int16_t lengthAndFlags = fUnion.fFields.fLengthAndFlags = src.fUnion.fFields.fLengthAndFlags;
  if(lengthAndFlags & kUsingStackBuffer) {
    // Short string using the stack buffer, copy the contents.
    // Check for self assignment to prevent "overlap in memcpy" warnings,
    // although it should be harmless to copy a buffer to itself exactly.
    if(this != &src) {
      uprv_memcpy(fUnion.fStackFields.fBuffer, src.fUnion.fStackFields.fBuffer,
                  getShortLength() * U_SIZEOF_UCHAR);
    }
  } else {
    // In all other cases, copy all fields.
    fUnion.fFields.fArray = src.fUnion.fFields.fArray;
    fUnion.fFields.fCapacity = src.fUnion.fFields.fCapacity;
    if(!hasShortLength()) {
      fUnion.fFields.fLength = src.fUnion.fFields.fLength;
    }
    if(setSrcToBogus) {
      // Set src to bogus without releasing any memory.
      src.fUnion.fFields.fLengthAndFlags = kIsBogus;
      src.fUnion.fFields.fArray = NULL;
      src.fUnion.fFields.fCapacity = 0;
    }
  }
}